

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsFederate helicsCreateCombinationFederateFromConfig(char *configFile,HelicsError *err)

{
  HelicsFederate pvVar1;
  allocator<char> local_69;
  shared_ptr<helics::Federate> fed;
  undefined1 local_58 [40];
  string local_30 [32];
  
  if (err == (HelicsError *)0x0) {
    if (configFile != (char *)0x0) {
LAB_0017dabb:
      fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::string<std::allocator<char>>(local_30,configFile,&local_69);
      std::make_shared<helics::CombinationFederate,std::__cxx11::string_const>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2> *)&fed,
                 (__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      std::__cxx11::string::~string(local_30);
      local_58._16_8_ = fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._24_8_ =
           fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pvVar1 = generateNewHelicsFederateObject
                         ((shared_ptr<helics::Federate> *)(local_58 + 0x10),COMBINATION);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return pvVar1;
    }
  }
  else if (err->error_code == 0) {
    if (configFile != (char *)0x0) goto LAB_0017dabb;
    err->error_code = -4;
    err->message = "The supplied string argument is null and therefore invalid";
  }
  return (HelicsFederate)0x0;
}

Assistant:

HelicsFederate helicsCreateCombinationFederateFromConfig(const char* configFile, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    CHECK_NULL_STRING(configFile, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        fed = std::make_shared<helics::CombinationFederate>(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }

    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::COMBINATION);
}